

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3lamb_io.c
# Opt level: O1

int s3lambcnt_write(char *fn,uint32 *lambda_cnt,uint32 n_lambda_cnt)

{
  int iVar1;
  int32 iVar2;
  FILE *fp;
  int iVar3;
  uint32 chksum;
  uint32 ignore;
  uint32 local_30 [2];
  
  local_30[0] = 0;
  local_30[1] = 0;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  fp = s3open(fn,"wb",(uint32 *)0x0);
  iVar3 = -1;
  if (fp != (FILE *)0x0) {
    iVar1 = bio_fwrite_1d(lambda_cnt,4,n_lambda_cnt,fp,local_30);
    if (iVar1 < 0) {
      s3close(fp);
    }
    else {
      iVar2 = bio_fwrite(local_30,4,1,fp,0,local_30 + 1);
      s3close(fp);
      if (iVar2 == 1) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
                ,0xfa,"Wrote %s [%u array]\n",fn,(ulong)n_lambda_cnt);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
s3lambcnt_write(const char *fn,
		const uint32 *lambda_cnt,
		uint32 n_lambda_cnt)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", LAMBDACNT_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);


    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite_1d((void *)lambda_cnt, sizeof(uint32), n_lambda_cnt, fp, &chksum) < 0) {
	s3close(fp);
	return S3_ERROR;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    s3close(fp);

    E_INFO("Wrote %s [%u array]\n", fn, n_lambda_cnt);

    return S3_SUCCESS;
}